

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O2

void __thiscall Blob_Detection::BlobInfo::_getWidth(BlobInfo *this)

{
  uint uVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var2
  ;
  
  if (((this->_contourX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->_contourX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish) && ((this->_width).found == false)) {
    _Var2 = std::
            __max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ();
    uVar1 = *_Var2._M_current;
    _Var2 = std::
            __min_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ((this->_contourX).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (this->_contourX).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    (this->_width).value = (uVar1 - *_Var2._M_current) + 1;
    (this->_width).found = true;
  }
  return;
}

Assistant:

void BlobInfo::_getWidth()
    {
        if( !_contourX.empty() && !_width.found ) {
            _width.value = *(std::max_element( _contourX.begin(), _contourX.end() )) -
                *(std::min_element( _contourX.begin(), _contourX.end() )) + 1;

            _width.found = true;
        }
    }